

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::Map
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  const_iterator first;
  const_iterator last;
  const_iterator local_58;
  const_iterator local_30;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_18;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other_local;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  local_18 = other;
  other_local = this;
  Map(this);
  begin(&local_30,local_18);
  end(&local_58,local_18);
  first.it_.m_ = local_30.it_.m_;
  first.it_.node_ = local_30.it_.node_;
  first.it_.bucket_index_ = local_30.it_.bucket_index_;
  last.it_.m_ = local_58.it_.m_;
  last.it_.node_ = local_58.it_.node_;
  last.it_.bucket_index_ = local_58.it_.bucket_index_;
  Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
  insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
            ((Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *)this,first,last);
  return;
}

Assistant:

Map(const Map& other) : Map() { insert(other.begin(), other.end()); }